

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O2

dino_route_t * list_add_new_item(dino_route_t **head)

{
  dino_route_t *pdVar1;
  dino_route_t *pdVar2;
  
  if (head != (dino_route_t **)0x0) {
    pdVar2 = *head;
    while (pdVar1 = pdVar2, pdVar1 != (dino_route_t *)0x0) {
      pdVar2 = pdVar1->next;
      head = &pdVar1->next;
    }
    pdVar2 = (dino_route_t *)memory_alloc(0x30);
    ((dino_route_t *)head)->next = pdVar2;
    return pdVar2;
  }
  return (dino_route_t *)0x0;
}

Assistant:

dino_route_t *list_add_new_item(dino_route_t **head) {
    // List is invalid.
    //
    if (NULL == head) {
        return NULL;
    }

    // List is empty.
    //
    if (NULL == *head) {
        *head = (dino_route_t *) memory_alloc(sizeof(dino_route_t));
        return *head;
    }

    // Add to the end of the list.
    //
    dino_route_t *ptr = *head;

    while (ptr->next != NULL) { ptr = ptr->next; }

    ptr->next = (dino_route_t *) memory_alloc(sizeof(dino_route_t));

    return ptr->next;
}